

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.hpp
# Opt level: O0

size_type __thiscall
boost::pool<boost::default_user_allocator_new_delete>::alloc_size
          (pool<boost::default_user_allocator_new_delete> *this)

{
  unsigned_long *puVar1;
  long in_RDI;
  size_type rem;
  size_type s;
  ulong local_10;
  
  puVar1 = std::max<unsigned_long>((unsigned_long *)(in_RDI + 0x18),&min_alloc_size);
  local_10 = *puVar1;
  if ((local_10 & 7) != 0) {
    local_10 = (8 - (local_10 & 7)) + local_10;
  }
  if (7 < local_10) {
    if ((local_10 & 7) == 0) {
      return local_10;
    }
    __assert_fail("s % min_align == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/pool/pool.hpp"
                  ,0x162,
                  "size_type boost::pool<>::alloc_size() const [UserAllocator = boost::default_user_allocator_new_delete]"
                 );
  }
  __assert_fail("s >= min_alloc_size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/pool/pool.hpp"
                ,0x161,
                "size_type boost::pool<>::alloc_size() const [UserAllocator = boost::default_user_allocator_new_delete]"
               );
}

Assistant:

size_type alloc_size() const
    { //!  Calculated size of the memory chunks that will be allocated by this Pool.
      //! \returns allocated size.
      // For alignment reasons, this used to be defined to be lcm(requested_size, sizeof(void *), sizeof(size_type)),
      // but is now more parsimonious: just rounding up to the minimum required alignment of our housekeeping data
      // when required.  This works provided all alignments are powers of two.
      size_type s = (std::max)(requested_size, min_alloc_size);
      size_type rem = s % min_align;
      if(rem)
         s += min_align - rem;
      BOOST_ASSERT(s >= min_alloc_size);
      BOOST_ASSERT(s % min_align == 0);
      return s;
    }